

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  string prefix_input;
  string _dbg_option;
  string local_88;
  xcard xc;
  string local_40;
  
  prefix_input._M_dataplus._M_p = (pointer)&prefix_input.field_2;
  prefix_input._M_string_length = 0;
  prefix_input.field_2._M_local_buf[0] = '\0';
  _dbg_option._M_dataplus._M_p = (pointer)&_dbg_option.field_2;
  _dbg_option._M_string_length = 0;
  _dbg_option.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,"Enter Prefix (Upto 15 digits): ");
  std::operator>>((istream *)&std::cin,(string *)&prefix_input);
  if (prefix_input._M_string_length < 0x10) {
    std::operator<<((ostream *)&std::cout,"Enable Debug Messages [Y/N]: ");
    std::operator>>((istream *)&std::cin,(string *)&_dbg_option);
    std::__cxx11::string::string((string *)&local_88,(string *)&prefix_input);
    bVar1 = std::operator==(&_dbg_option,"Y");
    xcard::xcard(&xc,&local_88,(uint)bVar1);
    std::__cxx11::string::~string((string *)&local_88);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,xc.VERSION);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = 10;
    while (bVar1 = lVar3 != 0, lVar3 = lVar3 + -1, bVar1) {
      xcard::generateCard_abi_cxx11_(&local_40,&xc);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_40);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__cxx11::string::~string((string *)&xc);
    std::__cxx11::string::~string((string *)&_dbg_option);
    std::__cxx11::string::~string((string *)&prefix_input);
    return 0;
  }
  __assert_fail("prefix_input.length() < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jkotra[P]xcard/src/demo.cpp"
                ,0xe,"int main()");
}

Assistant:

int main()
{

    std::string prefix_input;
    std::string _dbg_option;

    std::cout << "Enter Prefix (Upto 15 digits): ";
    std::cin >> prefix_input;
    assert(prefix_input.length() < 16);
    
    std::cout << "Enable Debug Messages [Y/N]: ";
    std::cin >> _dbg_option;

    xcard xc(prefix_input, _dbg_option == "Y" ? true : false);
    std::cout << xc.VERSION << std::endl;

    for (size_t i = 0; i < 10; i++)
    {
        std::cout << xc.generateCard() << std::endl; 
    }

    return 0;
}